

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O3

void BrotliCompressFragmentFastImpl11
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,int *table,
               uint8_t *cmd_depth,uint16_t *cmd_bits,size_t *cmd_code_numbits,uint8_t *cmd_code,
               size_t *storage_ix,uint8_t *storage)

{
  dword *pdVar1;
  char *pcVar2;
  size_t __n;
  uint8_t *puVar3;
  Elf64_Ehdr *pEVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long *end;
  long *plVar10;
  uint8_t *puVar11;
  ulong uVar12;
  uint32_t *puVar13;
  uint8_t *puVar14;
  ulong uVar15;
  byte bVar16;
  byte bVar17;
  ulong uVar18;
  uint8_t *puVar19;
  char *pcVar20;
  Elf64_Ehdr *array;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  long *begin;
  long *plVar24;
  long *data;
  long *__s2;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  long *__s1;
  dword *pdVar28;
  long *plVar29;
  uint32_t cmd_histo [128];
  uint8_t lit_depth [256];
  uint16_t lit_bits [256];
  int local_5ac;
  Elf64_Ehdr *local_5a8;
  Elf64_Ehdr *local_588;
  Elf64_Ehdr *local_580;
  ulong local_570;
  uint32_t local_538 [21];
  uint32_t local_4e4;
  uint32_t local_4e0;
  uint32_t local_4dc [24];
  uint32_t local_47c [17];
  uint32_t local_438 [16];
  int aiStack_3f8 [48];
  byte local_338 [256];
  uint16_t local_238 [260];
  
  local_588 = (Elf64_Ehdr *)0x18000;
  if (input_size < 0x18000) {
    local_588 = (Elf64_Ehdr *)input_size;
  }
  uVar25 = *storage_ix;
  if (input_size == 0) {
    if (is_last != 0) {
      *(ulong *)(storage + (uVar25 >> 3)) = (ulong)storage[uVar25 >> 3] | 1L << ((byte)uVar25 & 7);
      uVar27 = uVar25 + 1;
      *storage_ix = uVar27;
      *(ulong *)(storage + (uVar27 >> 3)) = (ulong)storage[uVar27 >> 3] | 1L << ((byte)uVar27 & 7);
      *storage_ix = (ulong)((int)uVar25 + 9U & 0xfffffff8);
      return;
    }
    __assert_fail("is_last",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                  ,0x1d3,
                  "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                 );
  }
  BrotliStoreMetaBlockHeader((size_t)local_588,0,storage_ix,storage);
  uVar27 = *storage_ix;
  uVar18 = uVar27 >> 3;
  *(ulong *)(storage + uVar18) = (ulong)storage[uVar18];
  *storage_ix = uVar27 + 0xd;
  local_570 = BuildAndStoreLiteralPrefixCode
                        (m,input,(size_t)local_588,local_338,local_238,storage_ix,storage);
  uVar27 = *cmd_code_numbits;
  if (7 < uVar27) {
    uVar18 = *storage_ix;
    uVar15 = 0;
    do {
      *(ulong *)(storage + (uVar18 >> 3)) =
           (ulong)cmd_code[uVar15 >> 3] << ((byte)uVar18 & 7) | (ulong)storage[uVar18 >> 3];
      uVar18 = uVar18 + 8;
      *storage_ix = uVar18;
      uVar27 = *cmd_code_numbits;
      uVar22 = uVar15 + 0xf;
      uVar15 = uVar15 + 8;
    } while (uVar22 < uVar27);
  }
  uVar7 = (uint)uVar27 & 7;
  if (cmd_code[uVar27 >> 3] >> (sbyte)uVar7 != 0) {
LAB_00120370:
    __assert_fail("(bits >> n_bits) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                  ,0x36,
                  "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
  }
  uVar18 = *storage_ix;
  *(ulong *)(storage + (uVar18 >> 3)) =
       (ulong)cmd_code[uVar27 >> 3] << ((byte)uVar18 & 7) | (ulong)storage[uVar18 >> 3];
  *storage_ix = uVar7 + uVar18;
  begin = (long *)input;
  local_5a8 = (Elf64_Ehdr *)input_size;
LAB_0011e94d:
  plVar24 = begin;
  __s1 = begin;
  local_580 = local_588;
  do {
    memcpy(local_538,kCmdHistoSeed,0x200);
    data = (long *)((long)plVar24 + (long)local_588);
    if ((Elf64_Ehdr *)0xf < local_588) {
      pdVar1 = (dword *)((long)&local_588[-1].e_shentsize + 1);
      pdVar28 = &local_5a8[-1].e_flags;
      if (pdVar1 < &local_5a8[-1].e_flags) {
        pdVar28 = pdVar1;
      }
      plVar10 = (long *)((long)plVar24 + 1);
      if (plVar10 <= __s1) {
        __assert_fail("next_emit < ip",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                      ,0x216,
                      "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                     );
      }
      plVar29 = (long *)((long)pdVar28 + (long)plVar24);
      local_5ac = -1;
      do {
        uVar27 = (ulong)(*plVar10 * 0x1e35a7bd000000) >> 0x35;
        uVar7 = 0x20;
        do {
          lVar23 = *plVar10;
          end = plVar10;
          uVar18 = uVar27;
          while( true ) {
            if ((uint)uVar18 != (uint)((ulong)(lVar23 * 0x1e35a7bd000000) >> 0x35)) {
              __assert_fail("hash == Hash(next_ip, shift)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                            ,0x21b,
                            "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                           );
            }
            plVar10 = (long *)((ulong)(uVar7 >> 5) + (long)end);
            if (plVar29 < plVar10) goto LAB_0011fbe3;
            uVar27 = (ulong)(*plVar10 * 0x1e35a7bd000000) >> 0x35;
            iVar9 = (int)input;
            if (((*(int *)((long)end + -(long)local_5ac) == (int)lVar23) &&
                (__s2 = (long *)((long)end + -(long)local_5ac),
                *(char *)((long)end + 4) == *(char *)((long)__s2 + 4))) && (0 < local_5ac)) break;
            if ((long)table[uVar18] < 0) {
              __assert_fail("candidate >= base_ip",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                            ,0x22a,
                            "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                           );
            }
            __s2 = (long *)(input + table[uVar18]);
            if (end <= __s2) {
              __assert_fail("candidate < ip",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                            ,0x22b,
                            "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                           );
            }
            table[uVar18] = (int)end - iVar9;
            if (((int)*end == (int)*__s2) && (*(char *)((long)end + 4) == *(char *)((long)__s2 + 4))
               ) goto LAB_0011eaa3;
            lVar23 = *plVar10;
            uVar7 = uVar7 + 1;
            end = plVar10;
            uVar18 = uVar27;
          }
          table[uVar18] = (int)end - iVar9;
LAB_0011eaa3:
          uVar7 = uVar7 + 1;
        } while (0x3fff0 < (long)end - (long)__s2);
        pcVar2 = (char *)((long)end + 5);
        puVar11 = (uint8_t *)((long)data + (-5 - (long)end));
        if ((uint8_t *)0x7 < puVar11) {
          uVar27 = (ulong)puVar11 & 0xfffffffffffffff8;
          pcVar20 = pcVar2 + uVar27;
          lVar23 = 0;
          uVar18 = 0;
LAB_0011eaec:
          uVar15 = *(ulong *)((long)__s2 + uVar18 * 8 + 5);
          if (*(ulong *)(pcVar2 + uVar18 * 8) == uVar15) goto code_r0x0011eafa;
          uVar15 = uVar15 ^ *(ulong *)(pcVar2 + uVar18 * 8);
          uVar27 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
            }
          }
          uVar18 = (uVar27 >> 3 & 0x1fffffff) - lVar23;
          goto LAB_0011eb21;
        }
        uVar27 = 0;
        pcVar20 = pcVar2;
LAB_0011fa36:
        uVar15 = (ulong)puVar11 & 7;
        uVar18 = uVar27;
        if (uVar15 != 0) {
          uVar22 = uVar27 | uVar15;
          do {
            uVar18 = uVar27;
            if (*(char *)((long)__s2 + uVar27 + 5) != *pcVar20) break;
            pcVar20 = pcVar20 + 1;
            uVar27 = uVar27 + 1;
            uVar15 = uVar15 - 1;
            uVar18 = uVar22;
          } while (uVar15 != 0);
        }
LAB_0011eb21:
        __n = uVar18 + 5;
        iVar8 = bcmp(end,__s2,__n);
        if (iVar8 != 0) {
          __assert_fail("0 == memcmp(base, candidate, matched)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                        ,0x242,
                        "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                       );
        }
        uVar27 = (long)end - (long)__s1;
        if (uVar27 < 0x1842) {
          if (uVar27 < 6) {
            bVar5 = cmd_depth[uVar27 + 0x28];
            if (cmd_bits[uVar27 + 0x28] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
            if (0x38 < bVar5) goto LAB_001203cd;
            uVar15 = *storage_ix;
            uVar12 = bVar5 + uVar15;
            *(ulong *)(storage + (uVar15 >> 3)) =
                 (ulong)cmd_bits[uVar27 + 0x28] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
            *storage_ix = uVar12;
            puVar13 = local_538 + (uVar27 | 0x28);
          }
          else if (uVar27 < 0x82) {
            uVar15 = uVar27 - 2;
            uVar7 = 0x1f;
            if ((uint)uVar15 != 0) {
              for (; (uint)uVar15 >> uVar7 == 0; uVar7 = uVar7 - 1) {
              }
            }
            uVar7 = (uVar7 ^ 0xffffffe0) + 0x1f;
            uVar22 = (ulong)uVar7;
            bVar17 = (byte)uVar7;
            uVar26 = uVar15 >> (bVar17 & 0x3f);
            lVar23 = uVar26 + uVar22 * 2;
            bVar5 = cmd_depth[lVar23 + 0x2a];
            if (cmd_bits[lVar23 + 0x2a] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
            if (0x38 < bVar5) goto LAB_001203cd;
            uVar6 = *storage_ix;
            uVar12 = bVar5 + uVar6;
            *(ulong *)(storage + (uVar6 >> 3)) =
                 (ulong)cmd_bits[lVar23 + 0x2a] << ((byte)uVar6 & 7) | (ulong)storage[uVar6 >> 3];
            *storage_ix = uVar12;
            uVar15 = uVar15 - (uVar26 << (bVar17 & 0x3f));
            if (uVar15 >> (bVar17 & 0x3f) != 0) goto LAB_00120370;
            *(ulong *)(storage + (uVar12 >> 3)) =
                 uVar15 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
            uVar12 = uVar12 + uVar22;
            *storage_ix = uVar12;
            puVar13 = local_538 + uVar26 + uVar22 * 2 + 0x2a;
          }
          else if (uVar27 < 0x842) {
            uVar7 = 0x1f;
            uVar21 = (uint)(uVar27 - 0x42);
            if (uVar21 != 0) {
              for (; uVar21 >> uVar7 == 0; uVar7 = uVar7 - 1) {
              }
            }
            lVar23 = 0x51 - (ulong)(uVar7 ^ 0x1f);
            bVar5 = cmd_depth[lVar23];
            if (cmd_bits[lVar23] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
            if (0x38 < bVar5) goto LAB_001203cd;
            uVar15 = *storage_ix;
            uVar12 = bVar5 + uVar15;
            *(ulong *)(storage + (uVar15 >> 3)) =
                 (ulong)cmd_bits[lVar23] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
            *storage_ix = uVar12;
            uVar15 = (-1L << ((byte)uVar7 & 0x3f)) + (uVar27 - 0x42);
            if (uVar15 >> ((byte)uVar7 & 0x3f) != 0) goto LAB_00120370;
            *(ulong *)(storage + (uVar12 >> 3)) =
                 uVar15 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
            uVar12 = uVar7 + uVar12;
            *storage_ix = uVar12;
            puVar13 = local_538 + lVar23;
          }
          else {
            bVar5 = cmd_depth[0x3d];
            if (cmd_bits[0x3d] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
            if (0x38 < bVar5) goto LAB_001203cd;
            uVar22 = *storage_ix;
            uVar15 = uVar22 + bVar5;
            uVar12 = uVar22 + bVar5 + 0xc;
            *(ulong *)(storage + (uVar22 >> 3)) =
                 (ulong)cmd_bits[0x3d] << ((byte)uVar22 & 7) | (ulong)storage[uVar22 >> 3];
            *storage_ix = uVar15;
            *(ulong *)(storage + (uVar15 >> 3)) =
                 uVar27 - 0x842 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
            *storage_ix = uVar12;
            puVar13 = &local_4e4;
          }
        }
        else {
          uVar15 = ((long)__s1 - (long)begin) * 0x32;
          if ((uVar15 < uVar27 || uVar15 - uVar27 == 0) && (0x3d4 < local_570)) {
            EmitUncompressedMetaBlock((uint8_t *)begin,(uint8_t *)end,uVar25,storage_ix,storage);
            local_5a8 = (Elf64_Ehdr *)
                        ((long)plVar24 + (long)(local_5a8->e_ident_magic_str + (-1 - (long)end)));
            data = end;
            goto LAB_0011ffaf;
          }
          if (uVar27 < 0x5842) {
            bVar5 = cmd_depth[0x3e];
            if (cmd_bits[0x3e] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
            if (0x38 < bVar5) goto LAB_001203cd;
            uVar22 = *storage_ix;
            uVar15 = uVar22 + bVar5;
            uVar12 = uVar22 + bVar5 + 0xe;
            *(ulong *)(storage + (uVar22 >> 3)) =
                 (ulong)cmd_bits[0x3e] << ((byte)uVar22 & 7) | (ulong)storage[uVar22 >> 3];
            *storage_ix = uVar15;
            *(ulong *)(storage + (uVar15 >> 3)) =
                 uVar27 - 0x1842 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
            *storage_ix = uVar12;
            puVar13 = &local_4e0;
          }
          else {
            bVar5 = cmd_depth[0x3f];
            if (cmd_bits[0x3f] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
            if (0x38 < bVar5) goto LAB_001203cd;
            uVar15 = *storage_ix;
            uVar12 = bVar5 + uVar15;
            *(ulong *)(storage + (uVar15 >> 3)) =
                 (ulong)cmd_bits[0x3f] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
            *storage_ix = uVar12;
            if (0xffffff < uVar27 - 0x5842) goto LAB_00120370;
            *(ulong *)(storage + (uVar12 >> 3)) =
                 uVar27 - 0x5842 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
            uVar12 = uVar12 + 0x18;
            *storage_ix = uVar12;
            puVar13 = local_4dc;
          }
        }
        *puVar13 = *puVar13 + 1;
        if (end != __s1) {
          lVar23 = 0;
          do {
            bVar5 = local_338[*(byte *)((long)__s1 + lVar23)];
            if (local_238[*(byte *)((long)__s1 + lVar23)] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
            if (0x38 < bVar5) goto LAB_001203cd;
            *(ulong *)(storage + (uVar12 >> 3)) =
                 (ulong)local_238[*(byte *)((long)__s1 + lVar23)] << ((byte)uVar12 & 7) |
                 (ulong)storage[uVar12 >> 3];
            uVar12 = uVar12 + bVar5;
            *storage_ix = uVar12;
            lVar23 = lVar23 + 1;
          } while (uVar27 + (uVar27 == 0) != lVar23);
        }
        iVar8 = (int)((long)end - (long)__s2);
        if (local_5ac == iVar8) {
          bVar5 = cmd_depth[0x40];
          if (cmd_bits[0x40] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
          if (0x38 < bVar5) goto LAB_001203cd;
          *(ulong *)(storage + (uVar12 >> 3)) =
               (ulong)cmd_bits[0x40] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
          uVar12 = bVar5 + uVar12;
          *storage_ix = uVar12;
          local_438[0] = local_438[0] + 1;
        }
        else {
          uVar27 = (long)iVar8 + 3;
          uVar7 = 0x1f;
          if ((uint)uVar27 != 0) {
            for (; (uint)uVar27 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar21 = 0x1e - (uVar7 ^ 0x1f);
          uVar15 = (ulong)((uVar27 >> ((ulong)uVar21 & 0x3f) & 1) != 0);
          uVar22 = ((uVar7 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar15;
          bVar5 = cmd_depth[uVar22 + 0x50];
          if (cmd_bits[uVar22 + 0x50] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
          if (0x38 < bVar5) goto LAB_001203cd;
          *(ulong *)(storage + (uVar12 >> 3)) =
               (ulong)cmd_bits[uVar22 + 0x50] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
          uVar12 = bVar5 + uVar12;
          *storage_ix = uVar12;
          uVar27 = uVar27 - (uVar15 + 2 << ((byte)uVar21 & 0x3f));
          if (uVar27 >> ((byte)uVar21 & 0x3f) != 0) goto LAB_00120370;
          if (0x38 < uVar21) goto LAB_001203cd;
          *(ulong *)(storage + (uVar12 >> 3)) =
               uVar27 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
          uVar12 = uVar21 + uVar12;
          *storage_ix = uVar12;
          aiStack_3f8[uVar22] = aiStack_3f8[uVar22] + 1;
          local_5ac = iVar8;
        }
        bVar5 = (byte)uVar12;
        if (__n < 0xc) {
          bVar17 = cmd_depth[uVar18 + 1];
          if (cmd_bits[uVar18 + 1] >> (bVar17 & 0x3f) != 0) goto LAB_00120370;
          if (0x38 < bVar17) goto LAB_001203cd;
          *(ulong *)(storage + (uVar12 >> 3)) =
               (ulong)cmd_bits[uVar18 + 1] << (bVar5 & 7) | (ulong)storage[uVar12 >> 3];
          *storage_ix = bVar17 + uVar12;
          puVar13 = local_538 + uVar18 + 1;
        }
        else if (__n < 0x48) {
          uVar27 = uVar18 - 3;
          uVar7 = 0x1f;
          if ((uint)uVar27 != 0) {
            for (; (uint)uVar27 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar7 = (uVar7 ^ 0xffffffe0) + 0x1f;
          uVar15 = (ulong)uVar7;
          bVar16 = (byte)uVar7;
          uVar22 = uVar27 >> (bVar16 & 0x3f);
          lVar23 = uVar22 + uVar15 * 2;
          bVar17 = cmd_depth[lVar23 + 4];
          if (cmd_bits[lVar23 + 4] >> (bVar17 & 0x3f) != 0) goto LAB_00120370;
          if (0x38 < bVar17) goto LAB_001203cd;
          *(ulong *)(storage + (uVar12 >> 3)) =
               (ulong)cmd_bits[lVar23 + 4] << (bVar5 & 7) | (ulong)storage[uVar12 >> 3];
          uVar12 = bVar17 + uVar12;
          *storage_ix = uVar12;
          uVar27 = uVar27 - (uVar22 << (bVar16 & 0x3f));
          if (uVar27 >> (bVar16 & 0x3f) != 0) goto LAB_00120370;
          *(ulong *)(storage + (uVar12 >> 3)) =
               uVar27 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
          *storage_ix = uVar12 + uVar15;
          puVar13 = local_538 + uVar22 + uVar15 * 2 + 4;
        }
        else {
          if (__n < 0x88) {
            uVar27 = uVar18 - 3 >> 5;
            bVar17 = cmd_depth[uVar27 + 0x1e];
            if (cmd_bits[uVar27 + 0x1e] >> (bVar17 & 0x3f) != 0) goto LAB_00120370;
            if (0x38 < bVar17) goto LAB_001203cd;
            *(ulong *)(storage + (uVar12 >> 3)) =
                 (ulong)cmd_bits[uVar27 + 0x1e] << (bVar5 & 7) | (ulong)storage[uVar12 >> 3];
            uVar15 = uVar12 + bVar17;
            *storage_ix = uVar15;
            *(ulong *)(storage + (uVar15 >> 3)) =
                 (ulong)((uint)(uVar18 - 3) & 0x1f) << ((byte)uVar15 & 7) |
                 (ulong)storage[uVar15 >> 3];
            uVar15 = uVar12 + bVar17 + 5;
            *storage_ix = uVar15;
            bVar5 = cmd_depth[0x40];
            if (cmd_bits[0x40] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
            if (0x38 < bVar5) goto LAB_001203cd;
            *(ulong *)(storage + (uVar15 >> 3)) =
                 (ulong)cmd_bits[0x40] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
            *storage_ix = bVar5 + uVar15;
            local_47c[uVar27 - 0x11] = local_47c[uVar27 - 0x11] + 1;
          }
          else {
            if (0x847 < __n) {
              bVar17 = cmd_depth[0x27];
              if (cmd_bits[0x27] >> (bVar17 & 0x3f) == 0) {
                if (bVar17 < 0x39) {
                  *(ulong *)(storage + (uVar12 >> 3)) =
                       (ulong)cmd_bits[0x27] << (bVar5 & 7) | (ulong)storage[uVar12 >> 3];
                  uVar12 = bVar17 + uVar12;
                  *storage_ix = uVar12;
                  if (uVar18 - 0x843 < 0x1000000) {
                    bVar17 = (byte)uVar12 & 7;
                    *(ulong *)(storage + (uVar12 >> 3)) =
                         uVar18 - 0x843 << bVar17 | (ulong)storage[uVar12 >> 3];
                    uVar12 = uVar12 + 0x18;
                    *storage_ix = uVar12;
                    bVar5 = cmd_depth[0x40];
                    if (cmd_bits[0x40] >> (bVar5 & 0x3f) == 0) {
                      if (bVar5 < 0x39) {
                        *(ulong *)(storage + (uVar12 >> 3)) =
                             (ulong)cmd_bits[0x40] << bVar17 | (ulong)storage[uVar12 >> 3];
                        *storage_ix = bVar5 + uVar12;
                        local_47c[0] = local_47c[0] + 1;
                        puVar13 = local_438;
                        goto LAB_0011f39b;
                      }
                      goto LAB_001203cd;
                    }
                  }
                  goto LAB_00120370;
                }
                goto LAB_001203cd;
              }
              goto LAB_00120370;
            }
            uVar7 = 0x1f;
            uVar21 = (uint)(uVar18 - 0x43);
            if (uVar21 != 0) {
              for (; uVar21 >> uVar7 == 0; uVar7 = uVar7 - 1) {
              }
            }
            lVar23 = 0x3b - (ulong)(uVar7 ^ 0x1f);
            bVar17 = cmd_depth[lVar23];
            if (cmd_bits[lVar23] >> (bVar17 & 0x3f) != 0) goto LAB_00120370;
            if (0x38 < bVar17) goto LAB_001203cd;
            *(ulong *)(storage + (uVar12 >> 3)) =
                 (ulong)cmd_bits[lVar23] << (bVar5 & 7) | (ulong)storage[uVar12 >> 3];
            uVar12 = bVar17 + uVar12;
            *storage_ix = uVar12;
            uVar27 = (-1L << ((byte)uVar7 & 0x3f)) + (uVar18 - 0x43);
            if (uVar27 >> ((byte)uVar7 & 0x3f) != 0) goto LAB_00120370;
            *(ulong *)(storage + (uVar12 >> 3)) =
                 uVar27 << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
            uVar12 = uVar7 + uVar12;
            *storage_ix = uVar12;
            bVar5 = cmd_depth[0x40];
            if (cmd_bits[0x40] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
            if (0x38 < bVar5) goto LAB_001203cd;
            *(ulong *)(storage + (uVar12 >> 3)) =
                 (ulong)cmd_bits[0x40] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
            *storage_ix = bVar5 + uVar12;
            local_538[lVar23] = local_538[lVar23] + 1;
          }
          puVar13 = local_438;
        }
LAB_0011f39b:
        __s1 = (long *)((long)end + uVar18 + 5);
        *puVar13 = *puVar13 + 1;
        if (plVar29 <= __s1) break;
        uVar27 = *(ulong *)((long)end + uVar18 + 2);
        uVar18 = (uVar27 >> 0x18) * 0x1e35a7bd000000 >> 0x35;
        iVar8 = (int)__s1 - iVar9;
        table[uVar27 * 0x1e35a7bd000000 >> 0x35] = iVar8 + -3;
        table[(uVar27 >> 8) * 0x1e35a7bd000000 >> 0x35] = iVar8 + -2;
        table[(uVar27 >> 0x10) * 0x1e35a7bd000000 >> 0x35] = iVar8 + -1;
        lVar23 = (long)table[uVar18];
        table[uVar18] = iVar8;
        if ((int)*__s1 == *(int *)(input + lVar23)) {
          do {
            puVar11 = input + lVar23;
            if (*(uint8_t *)((long)__s1 + 4) != puVar11[4]) break;
            puVar3 = (uint8_t *)((long)__s1 + 5);
            puVar14 = (uint8_t *)((long)data + (-5 - (long)__s1));
            if ((uint8_t *)0x7 < puVar14) {
              uVar18 = (ulong)puVar14 & 0xfffffffffffffff8;
              puVar19 = puVar3 + uVar18;
              lVar23 = 0;
              uVar27 = 0;
LAB_0011f45f:
              if (*(ulong *)(puVar3 + uVar27 * 8) == *(ulong *)(puVar11 + uVar27 * 8 + 5))
              goto code_r0x0011f46d;
              uVar18 = *(ulong *)(puVar11 + uVar27 * 8 + 5) ^ *(ulong *)(puVar3 + uVar27 * 8);
              uVar27 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = (uVar27 >> 3 & 0x1fffffff) - lVar23;
              goto LAB_0011f48f;
            }
            uVar18 = 0;
            puVar19 = puVar3;
LAB_0011f8e6:
            uVar15 = (ulong)puVar14 & 7;
            uVar27 = uVar18;
            if (uVar15 != 0) {
              uVar22 = uVar18 | uVar15;
              do {
                uVar27 = uVar18;
                if (puVar11[uVar18 + 5] != *puVar19) break;
                puVar19 = puVar19 + 1;
                uVar18 = uVar18 + 1;
                uVar15 = uVar15 - 1;
                uVar27 = uVar22;
              } while (uVar15 != 0);
            }
LAB_0011f48f:
            if (0x3fff0 < (long)__s1 - (long)puVar11) break;
            uVar18 = uVar27 + 5;
            iVar8 = bcmp(__s1,puVar11,uVar18);
            if (iVar8 != 0) {
              __assert_fail("0 == memcmp(base, candidate, matched)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                            ,0x27e,
                            "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                           );
            }
            if (uVar18 < 10) {
              bVar5 = cmd_depth[uVar27 + 0x13];
              if (cmd_bits[uVar27 + 0x13] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
              if (0x38 < bVar5) goto LAB_001203cd;
              uVar15 = *storage_ix;
              uVar22 = bVar5 + uVar15;
              *(ulong *)(storage + (uVar15 >> 3)) =
                   (ulong)cmd_bits[uVar27 + 0x13] << ((byte)uVar15 & 7) |
                   (ulong)storage[uVar15 >> 3];
              *storage_ix = uVar22;
              puVar13 = local_538 + uVar27 + 0x13;
            }
            else {
              if (uVar18 < 0x86) {
                uVar27 = uVar27 - 1;
                uVar7 = 0x1f;
                if ((uint)uVar27 != 0) {
                  for (; (uint)uVar27 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                  }
                }
                uVar7 = (uVar7 ^ 0xffffffe0) + 0x1f;
                uVar15 = (ulong)uVar7;
                bVar17 = (byte)uVar7;
                uVar12 = uVar27 >> (bVar17 & 0x3f);
                lVar23 = uVar12 + uVar15 * 2;
                bVar5 = cmd_depth[lVar23 + 0x14];
                if (cmd_bits[lVar23 + 0x14] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
                if (0x38 < bVar5) goto LAB_001203cd;
                uVar26 = *storage_ix;
                uVar22 = bVar5 + uVar26;
                *(ulong *)(storage + (uVar26 >> 3)) =
                     (ulong)cmd_bits[lVar23 + 0x14] << ((byte)uVar26 & 7) |
                     (ulong)storage[uVar26 >> 3];
                *storage_ix = uVar22;
                uVar27 = uVar27 - (uVar12 << (bVar17 & 0x3f));
                if (uVar27 >> (bVar17 & 0x3f) != 0) goto LAB_00120370;
                lVar23 = uVar12 + uVar15 * 2 + 0x14;
                *(ulong *)(storage + (uVar22 >> 3)) =
                     uVar27 << ((byte)uVar22 & 7) | (ulong)storage[uVar22 >> 3];
                uVar22 = uVar22 + uVar15;
                *storage_ix = uVar22;
              }
              else {
                if (0x845 < uVar18) {
                  bVar5 = cmd_depth[0x27];
                  if (cmd_bits[0x27] >> (bVar5 & 0x3f) == 0) {
                    if (bVar5 < 0x39) {
                      uVar15 = *storage_ix;
                      uVar22 = bVar5 + uVar15;
                      *(ulong *)(storage + (uVar15 >> 3)) =
                           (ulong)cmd_bits[0x27] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3]
                      ;
                      *storage_ix = uVar22;
                      if (uVar27 - 0x841 < 0x1000000) {
                        *(ulong *)(storage + (uVar22 >> 3)) =
                             uVar27 - 0x841 << ((byte)uVar22 & 7) | (ulong)storage[uVar22 >> 3];
                        uVar22 = uVar22 + 0x18;
                        *storage_ix = uVar22;
                        puVar13 = local_47c;
                        goto LAB_0011f767;
                      }
                      goto LAB_00120370;
                    }
                    goto LAB_001203cd;
                  }
                  goto LAB_00120370;
                }
                uVar7 = 0x1f;
                uVar21 = (uint)(uVar27 - 0x41);
                if (uVar21 != 0) {
                  for (; uVar21 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                  }
                }
                lVar23 = 0x3b - (ulong)(uVar7 ^ 0x1f);
                bVar5 = cmd_depth[lVar23];
                if (cmd_bits[lVar23] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
                if (0x38 < bVar5) goto LAB_001203cd;
                uVar15 = *storage_ix;
                uVar22 = bVar5 + uVar15;
                *(ulong *)(storage + (uVar15 >> 3)) =
                     (ulong)cmd_bits[lVar23] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
                *storage_ix = uVar22;
                uVar27 = (-1L << ((byte)uVar7 & 0x3f)) + (uVar27 - 0x41);
                if (uVar27 >> ((byte)uVar7 & 0x3f) != 0) goto LAB_00120370;
                *(ulong *)(storage + (uVar22 >> 3)) =
                     uVar27 << ((byte)uVar22 & 7) | (ulong)storage[uVar22 >> 3];
                uVar22 = uVar7 + uVar22;
                *storage_ix = uVar22;
              }
              puVar13 = local_538 + lVar23;
            }
LAB_0011f767:
            *puVar13 = *puVar13 + 1;
            local_5ac = (int)((long)__s1 - (long)puVar11);
            uVar27 = (long)local_5ac + 3;
            uVar7 = 0x1f;
            if ((uint)uVar27 != 0) {
              for (; (uint)uVar27 >> uVar7 == 0; uVar7 = uVar7 - 1) {
              }
            }
            uVar21 = 0x1e - (uVar7 ^ 0x1f);
            uVar15 = (ulong)((uVar27 >> ((ulong)uVar21 & 0x3f) & 1) != 0);
            uVar12 = ((uVar7 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar15;
            bVar5 = cmd_depth[uVar12 + 0x50];
            if (cmd_bits[uVar12 + 0x50] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
            if (0x38 < bVar5) goto LAB_001203cd;
            *(ulong *)(storage + (uVar22 >> 3)) =
                 (ulong)cmd_bits[uVar12 + 0x50] << ((byte)uVar22 & 7) | (ulong)storage[uVar22 >> 3];
            uVar22 = bVar5 + uVar22;
            *storage_ix = uVar22;
            uVar27 = uVar27 - (uVar15 + 2 << ((byte)uVar21 & 0x3f));
            if (uVar27 >> ((byte)uVar21 & 0x3f) != 0) goto LAB_00120370;
            if (0x38 < uVar21) goto LAB_001203cd;
            __s1 = (long *)((long)__s1 + uVar18);
            *(ulong *)(storage + (uVar22 >> 3)) =
                 uVar27 << ((byte)uVar22 & 7) | (ulong)storage[uVar22 >> 3];
            *storage_ix = uVar21 + uVar22;
            aiStack_3f8[uVar12] = aiStack_3f8[uVar12] + 1;
            if (plVar29 <= __s1) goto LAB_0011fbe3;
            uVar27 = *(ulong *)((long)__s1 + -3);
            uVar18 = (uVar27 >> 0x18) * 0x1e35a7bd000000 >> 0x35;
            iVar8 = (int)__s1 - iVar9;
            table[uVar27 * 0x1e35a7bd000000 >> 0x35] = iVar8 + -3;
            table[(uVar27 >> 8) * 0x1e35a7bd000000 >> 0x35] = iVar8 + -2;
            table[(uVar27 >> 0x10) * 0x1e35a7bd000000 >> 0x35] = iVar8 + -1;
            lVar23 = (long)table[uVar18];
            table[uVar18] = iVar8;
          } while ((int)*__s1 == *(int *)(input + lVar23));
        }
        plVar10 = (long *)((long)__s1 + 1);
      } while( true );
    }
LAB_0011fbe3:
    if (data < __s1) {
      __assert_fail("next_emit <= ip_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                    ,0x29f,
                    "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                   );
    }
    local_5a8 = (Elf64_Ehdr *)((long)local_5a8 - (long)local_588);
    local_588 = (Elf64_Ehdr *)0x10000;
    if (local_5a8 < (Elf64_Ehdr *)0x10000) {
      local_588 = local_5a8;
    }
    if (((local_5a8 == (Elf64_Ehdr *)0x0) ||
        (pEVar4 = (Elf64_Ehdr *)
                  (local_580->e_ident_magic_str + (long)(local_588->e_ident_magic_str + -2)),
        &Elf64_Ehdr_00100000 < pEVar4)) ||
       (array = local_588, iVar9 = ShouldMergeBlock((uint8_t *)data,(size_t)local_588,local_338),
       iVar9 == 0)) goto LAB_0011fc72;
    if (local_580 < (Elf64_Ehdr *)0x10001) {
      __assert_fail("total_block_size > (1 << 16)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment.c"
                    ,0x2a9,
                    "void BrotliCompressFragmentFastImpl(MemoryManager *, const uint8_t *, size_t, int, int *, size_t, uint8_t *, uint16_t *, size_t *, uint8_t *, size_t *, uint8_t *)"
                   );
    }
    UpdateBits((ulong)((int)pEVar4 - 1),(int)uVar25 + 3,(size_t)storage,&array->e_ident_magic_num);
    plVar24 = data;
    local_580 = pEVar4;
  } while( true );
code_r0x0011eafa:
  uVar18 = uVar18 + 1;
  lVar23 = lVar23 + -8;
  if ((ulong)puVar11 >> 3 == uVar18) goto LAB_0011fa36;
  goto LAB_0011eaec;
code_r0x0011f46d:
  uVar27 = uVar27 + 1;
  lVar23 = lVar23 + -8;
  if ((ulong)puVar14 >> 3 == uVar27) goto LAB_0011f8e6;
  goto LAB_0011f45f;
LAB_0011fc72:
  if (data <= __s1) goto LAB_0011ffaf;
  uVar27 = (long)data - (long)__s1;
  if (0x1841 < uVar27) {
    uVar18 = ((long)__s1 - (long)begin) * 0x32;
    if ((uVar18 < uVar27 || uVar18 - uVar27 == 0) && (0x3d4 < local_570)) {
      EmitUncompressedMetaBlock((uint8_t *)begin,(uint8_t *)data,uVar25,storage_ix,storage);
    }
    else {
      if (uVar27 < 0x5842) {
        bVar5 = cmd_depth[0x3e];
        if (cmd_bits[0x3e] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
        if (0x38 < bVar5) {
LAB_001203cd:
          __assert_fail("n_bits <= 56",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./write_bits.h"
                        ,0x37,
                        "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                       );
        }
        uVar15 = *storage_ix;
        uVar25 = uVar15 + bVar5;
        uVar18 = uVar15 + bVar5 + 0xe;
        *(ulong *)(storage + (uVar15 >> 3)) =
             (ulong)cmd_bits[0x3e] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
        *storage_ix = uVar25;
        *(ulong *)(storage + (uVar25 >> 3)) =
             uVar27 - 0x1842 << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3];
        puVar13 = &local_4e0;
      }
      else {
        bVar5 = cmd_depth[0x3f];
        if (cmd_bits[0x3f] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
        if (0x38 < bVar5) goto LAB_001203cd;
        uVar25 = *storage_ix;
        uVar18 = bVar5 + uVar25;
        *(ulong *)(storage + (uVar25 >> 3)) =
             (ulong)cmd_bits[0x3f] << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3];
        *storage_ix = uVar18;
        if (0xffffff < uVar27 - 0x5842) goto LAB_00120370;
        *(ulong *)(storage + (uVar18 >> 3)) =
             uVar27 - 0x5842 << ((byte)uVar18 & 7) | (ulong)storage[uVar18 >> 3];
        uVar18 = uVar18 + 0x18;
        puVar13 = local_4dc;
      }
      *storage_ix = uVar18;
      *puVar13 = *puVar13 + 1;
      uVar25 = 0;
      do {
        bVar5 = local_338[*(byte *)((long)__s1 + uVar25)];
        if (local_238[*(byte *)((long)__s1 + uVar25)] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
        if (0x38 < bVar5) goto LAB_001203cd;
        *(ulong *)(storage + (uVar18 >> 3)) =
             (ulong)local_238[*(byte *)((long)__s1 + uVar25)] << ((byte)uVar18 & 7) |
             (ulong)storage[uVar18 >> 3];
        uVar18 = uVar18 + bVar5;
        *storage_ix = uVar18;
        uVar25 = uVar25 + 1;
      } while (uVar27 != uVar25);
    }
    goto LAB_0011ffaf;
  }
  if (uVar27 < 6) {
    bVar5 = cmd_depth[uVar27 + 0x28];
    if (cmd_bits[uVar27 + 0x28] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
    if (0x38 < bVar5) goto LAB_001203cd;
    uVar25 = uVar27 | 0x28;
    uVar18 = *storage_ix;
    uVar15 = bVar5 + uVar18;
    *(ulong *)(storage + (uVar18 >> 3)) =
         (ulong)cmd_bits[uVar27 + 0x28] << ((byte)uVar18 & 7) | (ulong)storage[uVar18 >> 3];
LAB_0011fcfe:
    *storage_ix = uVar15;
    puVar13 = local_538 + uVar25;
  }
  else if (uVar27 < 0x82) {
    uVar25 = uVar27 - 2;
    uVar7 = 0x1f;
    if ((uint)uVar25 != 0) {
      for (; (uint)uVar25 >> uVar7 == 0; uVar7 = uVar7 - 1) {
      }
    }
    uVar7 = (uVar7 ^ 0xffffffe0) + 0x1f;
    uVar18 = (ulong)uVar7;
    bVar17 = (byte)uVar7;
    uVar22 = uVar25 >> (bVar17 & 0x3f);
    lVar23 = uVar22 + uVar18 * 2;
    bVar5 = cmd_depth[lVar23 + 0x2a];
    if (cmd_bits[lVar23 + 0x2a] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
    if (0x38 < bVar5) goto LAB_001203cd;
    uVar12 = *storage_ix;
    uVar15 = bVar5 + uVar12;
    *(ulong *)(storage + (uVar12 >> 3)) =
         (ulong)cmd_bits[lVar23 + 0x2a] << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
    *storage_ix = uVar15;
    uVar25 = uVar25 - (uVar22 << (bVar17 & 0x3f));
    if (uVar25 >> (bVar17 & 0x3f) != 0) goto LAB_00120370;
    *(ulong *)(storage + (uVar15 >> 3)) = uVar25 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3]
    ;
    uVar15 = uVar15 + uVar18;
    *storage_ix = uVar15;
    puVar13 = local_538 + uVar22 + uVar18 * 2 + 0x2a;
  }
  else {
    if (uVar27 < 0x842) {
      uVar7 = 0x1f;
      uVar21 = (uint)(uVar27 - 0x42);
      if (uVar21 != 0) {
        for (; uVar21 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar25 = 0x51 - (ulong)(uVar7 ^ 0x1f);
      bVar5 = cmd_depth[uVar25];
      if (cmd_bits[uVar25] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
      if (0x38 < bVar5) goto LAB_001203cd;
      uVar18 = *storage_ix;
      uVar15 = bVar5 + uVar18;
      *(ulong *)(storage + (uVar18 >> 3)) =
           (ulong)cmd_bits[uVar25] << ((byte)uVar18 & 7) | (ulong)storage[uVar18 >> 3];
      *storage_ix = uVar15;
      uVar18 = (-1L << ((byte)uVar7 & 0x3f)) + (uVar27 - 0x42);
      if (uVar18 >> ((byte)uVar7 & 0x3f) != 0) goto LAB_00120370;
      *(ulong *)(storage + (uVar15 >> 3)) =
           uVar18 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      uVar15 = uVar7 + uVar15;
      goto LAB_0011fcfe;
    }
    bVar5 = cmd_depth[0x3d];
    if (cmd_bits[0x3d] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
    if (0x38 < bVar5) goto LAB_001203cd;
    uVar18 = *storage_ix;
    uVar25 = uVar18 + bVar5;
    uVar15 = uVar18 + bVar5 + 0xc;
    *(ulong *)(storage + (uVar18 >> 3)) =
         (ulong)cmd_bits[0x3d] << ((byte)uVar18 & 7) | (ulong)storage[uVar18 >> 3];
    *storage_ix = uVar25;
    *(ulong *)(storage + (uVar25 >> 3)) =
         uVar27 - 0x842 << ((byte)uVar25 & 7) | (ulong)storage[uVar25 >> 3];
    *storage_ix = uVar15;
    puVar13 = &local_4e4;
  }
  *puVar13 = *puVar13 + 1;
  lVar23 = 0;
  do {
    bVar5 = local_338[*(byte *)((long)__s1 + lVar23)];
    if (local_238[*(byte *)((long)__s1 + lVar23)] >> (bVar5 & 0x3f) != 0) goto LAB_00120370;
    if (0x38 < bVar5) goto LAB_001203cd;
    *(ulong *)(storage + (uVar15 >> 3)) =
         (ulong)local_238[*(byte *)((long)__s1 + lVar23)] << ((byte)uVar15 & 7) |
         (ulong)storage[uVar15 >> 3];
    uVar15 = uVar15 + bVar5;
    *storage_ix = uVar15;
    lVar23 = lVar23 + 1;
  } while (uVar27 + (uVar27 == 0) != lVar23);
LAB_0011ffaf:
  if (local_5a8 == (Elf64_Ehdr *)0x0) {
    if (is_last != 0) {
      uVar27 = *storage_ix;
      *(ulong *)(storage + (uVar27 >> 3)) = (ulong)storage[uVar27 >> 3] | 1L << ((byte)uVar27 & 7);
      uVar25 = uVar27 + 1;
      *storage_ix = uVar25;
      *(ulong *)(storage + (uVar25 >> 3)) = (ulong)storage[uVar25 >> 3] | 1L << ((byte)uVar25 & 7);
      *storage_ix = (ulong)((int)uVar27 + 9U & 0xfffffff8);
      return;
    }
    *cmd_code = '\0';
    *cmd_code_numbits = 0;
    BuildAndStoreCommandPrefixCode(local_538,cmd_depth,cmd_bits,cmd_code_numbits,cmd_code);
    return;
  }
  local_588 = (Elf64_Ehdr *)0x18000;
  if (local_5a8 < (Elf64_Ehdr *)0x18000) {
    local_588 = local_5a8;
  }
  uVar25 = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)local_588,0,storage_ix,storage);
  uVar27 = *storage_ix;
  uVar18 = uVar27 >> 3;
  *(ulong *)(storage + uVar18) = (ulong)storage[uVar18];
  *storage_ix = uVar27 + 0xd;
  local_570 = BuildAndStoreLiteralPrefixCode
                        (m,(uint8_t *)data,(size_t)local_588,local_338,local_238,storage_ix,storage)
  ;
  BuildAndStoreCommandPrefixCode(local_538,cmd_depth,cmd_bits,storage_ix,storage);
  begin = data;
  goto LAB_0011e94d;
}

Assistant:

void BrotliCompressFragmentFast(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, int* table, size_t table_size, uint8_t cmd_depth[128],
    uint16_t cmd_bits[128], size_t* cmd_code_numbits, uint8_t* cmd_code,
    size_t* storage_ix, uint8_t* storage) {
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                                     \
    case B:                                                          \
      BrotliCompressFragmentFastImpl ## B(                           \
          m, input, input_size, is_last, table, cmd_depth, cmd_bits, \
          cmd_code_numbits, cmd_code, storage_ix, storage);          \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: assert(0); break;
  }
}